

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

Vector2i __thiscall sf::priv::WindowImplX11::getPosition(WindowImplX11 *this)

{
  int iVar1;
  Window WVar2;
  bool bVar3;
  int iVar4;
  Atom AVar5;
  Window WVar6;
  Window WVar7;
  ulong uVar8;
  Display *pDVar9;
  long lVar10;
  int yAbsRelToRoot;
  int xAbsRelToRoot;
  uint height;
  int xRelToRoot;
  Window root;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  uint width;
  int yRelToRoot;
  undefined4 uStack_44;
  uint depth;
  uint borderWidth;
  Window child;
  
  pDVar9 = this->m_display;
  XTranslateCoordinates
            (pDVar9,this->m_window,
             *(undefined8 *)(*(long *)(pDVar9 + 0xe8) + 0x10 + (long)*(int *)(pDVar9 + 0xe0) * 0x80)
             ,0,0,&xAbsRelToRoot,&yAbsRelToRoot,&child);
  bVar3 = anon_unknown.dwarf_f07af::ewmhSupported();
  if (bVar3) {
    lVar10 = 0;
    do {
      bVar3 = operator==((String *)((anonymous_namespace)::wmAbsPosGood + lVar10),
                         (String *)(anonymous_namespace)::windowManagerName);
      if (bVar3) {
        uVar8 = (ulong)(uint)yAbsRelToRoot;
        xRelToRoot = xAbsRelToRoot;
        goto LAB_00140e11;
      }
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x60);
  }
  WVar7 = this->m_window;
  pDVar9 = this->m_display;
  bVar3 = anon_unknown.dwarf_f07af::ewmhSupported();
  if (bVar3) {
    root = (Window)&local_60;
    _xRelToRoot = 0x12;
    root = std::__cxx11::string::_M_create((ulong *)&root,(ulong)&xRelToRoot);
    local_60._M_allocated_capacity = _xRelToRoot;
    builtin_strncpy((char *)root,"_NET_FRAME_EXTENTS",0x12);
    local_68 = _xRelToRoot;
    *(char *)(root + _xRelToRoot) = '\0';
    AVar5 = getAtom((string *)&root,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)root != &local_60) {
      operator_delete((void *)root,local_60._M_allocated_capacity + 1);
    }
    if (AVar5 != 0) {
      _width = (int *)0x0;
      iVar4 = XGetWindowProperty(pDVar9,WVar7,AVar5,0,4,0,6,(string *)&root,&height,&xRelToRoot,
                                 &yRelToRoot,&width);
      if (((CONCAT44(uStack_44,yRelToRoot) == 0 && _xRelToRoot == 4) &&
          ((height == 0x20 && root == 6) && iVar4 == 0)) && _width != (int *)0x0) {
        iVar4 = *_width;
        iVar1 = _width[4];
        XFree();
        xRelToRoot = xAbsRelToRoot - iVar4;
        uVar8 = (ulong)(uint)(yAbsRelToRoot - iVar1);
        goto LAB_00140e11;
      }
      if (_width != (int *)0x0) {
        XFree();
      }
    }
  }
  WVar7 = this->m_window;
  pDVar9 = this->m_display;
  WVar2 = *(Window *)(*(long *)(pDVar9 + 0xe8) + 0x10 + (long)*(int *)(pDVar9 + 0xe0) * 0x80);
  root = WVar2;
  while( true ) {
    WVar6 = anon_unknown.dwarf_f07af::getParentWindow(pDVar9,WVar7);
    if (WVar6 == WVar2) break;
    WVar7 = anon_unknown.dwarf_f07af::getParentWindow(this->m_display,WVar7);
    pDVar9 = this->m_display;
  }
  XGetGeometry(this->m_display,WVar7,&root,&xRelToRoot,&yRelToRoot,&width,&height,&borderWidth,
               &depth);
  uVar8 = (ulong)(uint)yRelToRoot;
LAB_00140e11:
  return (Vector2i)((ulong)(uint)xRelToRoot | uVar8 << 0x20);
}

Assistant:

Vector2i WindowImplX11::getPosition() const
{
    // Get absolute position of our window relative to root window. This
    // takes into account all information that X11 has, including X11
    // border widths and any decorations. It corresponds to where the
    // window actually is, but not necessarily to where we told it to
    // go using setPosition() and XMoveWindow(). To have the two match
    // as expected, we may have to subtract decorations and borders.
    ::Window child;
    int xAbsRelToRoot, yAbsRelToRoot;

    XTranslateCoordinates(m_display, m_window, DefaultRootWindow(m_display),
        0, 0, &xAbsRelToRoot, &yAbsRelToRoot, &child);

    // CASE 1: some rare WMs actually put the window exactly where we tell
    // it to, even with decorations and such, which get shifted back.
    // In these rare cases, we can use the absolute value directly.
    if (isWMAbsolutePositionGood())
        return Vector2i(xAbsRelToRoot, yAbsRelToRoot);

    // CASE 2: most modern WMs support EWMH and can define _NET_FRAME_EXTENTS
    // with the exact frame size to subtract, so if present, we prefer it and
    // query it first. According to spec, this already includes any borders.
    long xFrameExtent, yFrameExtent;

    if (getEWMHFrameExtents(m_display, m_window, xFrameExtent, yFrameExtent))
    {
        // Get final X/Y coordinates: subtract EWMH frame extents from
        // absolute window position.
        return Vector2i((xAbsRelToRoot - xFrameExtent), (yAbsRelToRoot - yFrameExtent));
    }

    // CASE 3: EWMH frame extents were not available, use geometry.
    // We climb back up to the window before the root and use its
    // geometry information to extract X/Y position. This because
    // re-parenting WMs may re-parent the window multiple times, so
    // we'd have to climb up to the furthest ancestor and sum the
    // relative differences and borders anyway; and doing that to
    // subtract those values from the absolute coordinates of the
    // window is equivalent to going up the tree and asking the
    // furthest ancestor what it's relative distance to the root is.
    // So we use that approach because it's simpler.
    // This approach assumes that any window between the root and
    // our window is part of decorations/borders in some way. This
    // seems to hold true for most reasonable WM implementations.
    ::Window ancestor = m_window;
    ::Window root = DefaultRootWindow(m_display);

    while (getParentWindow(m_display, ancestor) != root)
    {
        // Next window up (parent window).
        ancestor = getParentWindow(m_display, ancestor);
    }

    // Get final X/Y coordinates: take the relative position to
    // the root of the furthest ancestor window.
    int xRelToRoot, yRelToRoot;
    unsigned int width, height, borderWidth, depth;

    XGetGeometry(m_display, ancestor, &root, &xRelToRoot, &yRelToRoot,
        &width, &height, &borderWidth, &depth);

    return Vector2i(xRelToRoot, yRelToRoot);
}